

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O3

bool __thiscall
boost::algorithm::
split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::equal(split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *this,split_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *Other)

{
  char *__s1;
  char *pcVar1;
  char *__s2;
  byte bVar2;
  int iVar3;
  byte bVar4;
  size_t __n;
  
  bVar2 = (this->
          super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).m_Finder.super_function_base.vtable == (vtable_base *)0x0 | this->m_bEof;
  bVar4 = (Other->
          super_find_iterator_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ).m_Finder.super_function_base.vtable == (vtable_base *)0x0 | Other->m_bEof;
  if (((bVar2 | bVar4) & 1) == 0) {
    __s1 = (this->m_Match).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin._M_current;
    pcVar1 = (this->m_Match).
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
             .m_End._M_current;
    __s2 = (Other->m_Match).
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
           .
           super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
           .m_Begin._M_current;
    __n = (long)pcVar1 - (long)__s1;
    if ((__n == (long)(Other->m_Match).
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
                      .
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
                      .
                      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
                      .m_End._M_current - (long)__s2) &&
       (((pcVar1 == __s1 || (iVar3 = bcmp(__s1,__s2,__n), iVar3 == 0)) &&
        ((this->m_Next)._M_current == (Other->m_Next)._M_current)))) {
      bVar2 = (this->m_End)._M_current == (Other->m_End)._M_current;
    }
    else {
      bVar2 = 0;
    }
  }
  else {
    bVar2 = bVar2 ^ bVar4 ^ 1;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool empty() const { return !vtable; }